

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O2

Font * __thiscall sf::Font::operator=(Font *this,Font *right)

{
  bool bVar1;
  int *piVar2;
  pointer puVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  pointer puVar8;
  pointer puVar9;
  Font local_b8;
  
  Font(&local_b8,right);
  pvVar4 = this->m_library;
  pvVar5 = this->m_face;
  this->m_library = local_b8.m_library;
  this->m_face = local_b8.m_face;
  pvVar6 = this->m_streamRec;
  pvVar7 = this->m_stroker;
  this->m_streamRec = local_b8.m_streamRec;
  this->m_stroker = local_b8.m_stroker;
  piVar2 = this->m_refCount;
  this->m_refCount = local_b8.m_refCount;
  bVar1 = this->m_isSmooth;
  this->m_isSmooth = local_b8.m_isSmooth;
  local_b8.m_library = pvVar4;
  local_b8.m_face = pvVar5;
  local_b8.m_streamRec = pvVar6;
  local_b8.m_stroker = pvVar7;
  local_b8.m_refCount = piVar2;
  local_b8.m_isSmooth = bVar1;
  std::swap<sf::Font::Info>(&this->m_info,&local_b8.m_info);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sf::Font::Page>,_std::_Select1st<std::pair<const_unsigned_int,_sf::Font::Page>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  ::swap(&(this->m_pages)._M_t,&local_b8.m_pages._M_t);
  puVar3 = (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.m_pixelBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar8 = (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar9 = (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b8.m_pixelBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.m_pixelBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_b8.m_pixelBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar8;
  local_b8.m_pixelBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar9;
  local_b8.m_pixelBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar3;
  ~Font(&local_b8);
  return this;
}

Assistant:

Font& Font::operator =(const Font& right)
{
    Font temp(right);

    std::swap(m_library,     temp.m_library);
    std::swap(m_face,        temp.m_face);
    std::swap(m_streamRec,   temp.m_streamRec);
    std::swap(m_stroker,     temp.m_stroker);
    std::swap(m_refCount,    temp.m_refCount);
    std::swap(m_isSmooth,    temp.m_isSmooth);
    std::swap(m_info,        temp.m_info);
    std::swap(m_pages,       temp.m_pages);
    std::swap(m_pixelBuffer, temp.m_pixelBuffer);

    #ifdef SFML_SYSTEM_ANDROID
        std::swap(m_stream, temp.m_stream);
    #endif

    return *this;
}